

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  int iVar1;
  TestProperty *this;
  Message *pMVar2;
  char *__s;
  long in_FS_OFFSET;
  TestProperty *property;
  int i;
  string *indent_local;
  TestResult *result_local;
  allocator<char> local_61;
  char *local_60;
  Message local_58;
  Message attributes;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message(&local_58);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = TestResult::test_property_count(result);
    if (iVar1 <= property._4_4_) break;
    this = TestResult::GetTestProperty(result,property._4_4_);
    pMVar2 = Message::operator<<(&local_58,(char (*) [3])0x1eaf28);
    pMVar2 = Message::operator<<(pMVar2,indent);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1eaf25);
    local_60 = TestProperty::key(this);
    pMVar2 = Message::operator<<(pMVar2,&local_60);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [4])"\": ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1eaf25);
    __s = TestProperty::value(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&attributes,__s,&local_61);
    EscapeJson(&local_30,(string *)&attributes);
    pMVar2 = Message::operator<<(pMVar2,&local_30);
    Message::operator<<(pMVar2,(char (*) [2])0x1eaf25);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&attributes);
    std::allocator<char>::~allocator(&local_61);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_58);
  Message::~Message(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}